

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::SupportedCombinationTest::iterate(SupportedCombinationTest *this)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Self __tmp;
  FormatDB *this_00;
  ImageFormat none;
  _Self __tmp_1;
  FormatCombination comb;
  Formats stencilFmts;
  Formats depthFmts;
  Formats colorFmts;
  
  this_00 = &((this->super_TestBase).m_ctx)->m_coreFormats;
  none.format = 0;
  none.unsizedType = 0;
  deqp::gls::FboUtil::FormatDB::getFormats(&colorFmts,this_00,COLOR_RENDERABLE);
  deqp::gls::FboUtil::FormatDB::getFormats(&depthFmts,this_00,DEPTH_RENDERABLE);
  deqp::gls::FboUtil::FormatDB::getFormats(&stencilFmts,this_00,STENCIL_RENDERABLE);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
  ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
            ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
              *)&colorFmts,&none);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
  ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
            ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
              *)&depthFmts,&none);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
  ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
            ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
              *)&stencilFmts,&none);
  bVar1 = false;
  p_Var4 = colorFmts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &colorFmts._M_t._M_impl.super__Rb_tree_header) {
      if (bVar1) {
        deqp::gls::fboc::details::TestBase::pass(&this->super_TestBase);
      }
      else {
        deqp::gls::fboc::details::TestBase::fail
                  (&this->super_TestBase,"No supported format combination found");
      }
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~_Rb_tree(&stencilFmts._M_t);
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~_Rb_tree(&depthFmts._M_t);
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~_Rb_tree(&colorFmts._M_t);
      return STOP;
    }
    comb.colorFmt.format = p_Var4[1]._M_color;
    comb.colorFmt.unsizedType = *(GLenum *)&p_Var4[1].field_0x4;
    comb.colorKind = formatKind(this,comb.colorFmt);
    for (p_Var3 = depthFmts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &depthFmts._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      comb.depthFmt.format = p_Var3[1]._M_color;
      comb.depthFmt.unsizedType = *(GLenum *)&p_Var3[1].field_0x4;
      comb.depthKind = formatKind(this,comb.depthFmt);
      p_Var2 = stencilFmts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var2 != &stencilFmts._M_t._M_impl.super__Rb_tree_header) {
        comb.stencilFmt.format = p_Var2[1]._M_color;
        comb.stencilFmt.unsizedType = *(GLenum *)&p_Var2[1].field_0x4;
        comb.stencilKind = formatKind(this,comb.stencilFmt);
        bVar1 = tryCombination(this,&comb);
        if (bVar1) {
          bVar1 = true;
          break;
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        bVar1 = false;
      }
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

IterateResult SupportedCombinationTest::iterate (void)
{
	const FormatDB& db		= m_ctx.getCoreFormats();
	const ImageFormat none	= ImageFormat::none();
	Formats colorFmts		= db.getFormats(COLOR_RENDERABLE);
	Formats depthFmts		= db.getFormats(DEPTH_RENDERABLE);
	Formats stencilFmts		= db.getFormats(STENCIL_RENDERABLE);
	FormatCombination comb;
	bool succ = false;

	colorFmts.insert(none);
	depthFmts.insert(none);
	stencilFmts.insert(none);

	for (Formats::const_iterator col = colorFmts.begin(); col != colorFmts.end(); col++)
	{
		comb.colorFmt = *col;
		comb.colorKind = formatKind(*col);
		for (Formats::const_iterator dep = depthFmts.begin(); dep != depthFmts.end(); dep++)
		{
			comb.depthFmt = *dep;
			comb.depthKind = formatKind(*dep);
			for (Formats::const_iterator stc = stencilFmts.begin();
				 stc != stencilFmts.end(); stc++)
			{
				comb.stencilFmt = *stc;
				comb.stencilKind = formatKind(*stc);
				succ = tryCombination(comb);
				if (succ)
					break;
			}
		}
	}

	if (succ)
		pass();
	else
		fail("No supported format combination found");

	return STOP;
}